

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::selectionSort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  reduceDB_lt local_38;
  
  if (1 < size) {
    uVar6 = 1;
    uVar5 = 0;
    local_38.ca = lt.ca;
    do {
      uVar1 = uVar5 + 1;
      uVar8 = uVar5 & 0xffffffff;
      uVar7 = uVar6;
      do {
        bVar3 = reduceDB_lt::operator()(&local_38,array[uVar7],array[(int)(uint)uVar8]);
        uVar4 = (uint)uVar7;
        if (!bVar3) {
          uVar4 = (uint)uVar8;
        }
        uVar7 = uVar7 + 1;
        uVar8 = (ulong)uVar4;
      } while ((uint)size != uVar7);
      uVar2 = array[uVar5];
      array[uVar5] = array[(int)uVar4];
      array[(int)uVar4] = uVar2;
      uVar6 = uVar6 + 1;
      uVar5 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}